

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase317::run(TestCase317 *this)

{
  Bounded<5UL,_unsigned_char> BVar1;
  Bounded<5UL,_unsigned_char> BVar2;
  Bounded<4UL,_unsigned_char> BVar3;
  Bounded<4UL,_unsigned_char> BVar4;
  Bounded<5UL,_unsigned_short> BVar5;
  Bounded<4UL,_unsigned_short> BVar6;
  Bounded<5UL,_unsigned_short> BVar7;
  Bounded<4UL,_unsigned_short> BVar8;
  Bounded<4UL,_unsigned_short> BVar9;
  TestCase317 *this_local;
  
  bounded<5u>();
  bounded<4u>();
  bounded<5u>();
  max<4U,_5U>();
  (anonymous_namespace)::assertTypeAndValue<kj::BoundedConst<5u>>();
  bounded<5u>();
  bounded<5u>();
  bounded<4u>();
  max<5U,_4U>();
  (anonymous_namespace)::assertTypeAndValue<kj::BoundedConst<5u>>();
  bounded<4u>();
  bounded<4u>();
  bounded<4u>();
  max<4U,_4U>();
  (anonymous_namespace)::assertTypeAndValue<kj::BoundedConst<4u>>();
  bounded<4u>();
  bounded<4u>();
  bounded<5u>();
  min<4U,_5U>();
  (anonymous_namespace)::assertTypeAndValue<kj::BoundedConst<4u>>();
  bounded<4u>();
  bounded<5u>();
  bounded<4u>();
  min<5U,_4U>();
  (anonymous_namespace)::assertTypeAndValue<kj::BoundedConst<4u>>();
  bounded<4u>();
  bounded<4u>();
  bounded<4u>();
  min<4U,_4U>();
  (anonymous_namespace)::assertTypeAndValue<kj::BoundedConst<4u>>();
  BVar5 = (anonymous_namespace)::boundedValue<5u,unsigned_short>(3);
  BVar6 = (anonymous_namespace)::boundedValue<4u,unsigned_short>(3);
  BVar1 = (anonymous_namespace)::boundedValue<5u,unsigned_char>('\x02');
  BVar7 = max<4ul,5ul,unsigned_short,unsigned_char>(BVar6,BVar1);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<5ul,unsigned_short>>(BVar5,BVar7);
  BVar5 = (anonymous_namespace)::boundedValue<5u,unsigned_short>(3);
  BVar1 = (anonymous_namespace)::boundedValue<5u,unsigned_char>('\x02');
  BVar6 = (anonymous_namespace)::boundedValue<4u,unsigned_short>(3);
  BVar7 = max<5ul,4ul,unsigned_char,unsigned_short>(BVar1,BVar6);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<5ul,unsigned_short>>(BVar5,BVar7);
  BVar6 = (anonymous_namespace)::boundedValue<4u,unsigned_short>(3);
  BVar8 = (anonymous_namespace)::boundedValue<4u,unsigned_short>(3);
  BVar9 = (anonymous_namespace)::boundedValue<4u,unsigned_short>(3);
  BVar8 = max<4ul,4ul,unsigned_short,unsigned_short>(BVar8,BVar9);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_short>>(BVar6,BVar8);
  BVar6 = (anonymous_namespace)::boundedValue<4u,unsigned_short>(2);
  BVar8 = (anonymous_namespace)::boundedValue<4u,unsigned_short>(3);
  BVar1 = (anonymous_namespace)::boundedValue<5u,unsigned_char>('\x02');
  BVar8 = min<4ul,5ul,unsigned_short,unsigned_char>(BVar8,BVar1);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_short>>(BVar6,BVar8);
  BVar6 = (anonymous_namespace)::boundedValue<4u,unsigned_short>(2);
  BVar1 = (anonymous_namespace)::boundedValue<5u,unsigned_char>('\x02');
  BVar8 = (anonymous_namespace)::boundedValue<4u,unsigned_short>(3);
  BVar8 = min<5ul,4ul,unsigned_char,unsigned_short>(BVar1,BVar8);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_short>>(BVar6,BVar8);
  BVar6 = (anonymous_namespace)::boundedValue<4u,unsigned_short>(3);
  BVar8 = (anonymous_namespace)::boundedValue<4u,unsigned_short>(3);
  BVar9 = (anonymous_namespace)::boundedValue<4u,unsigned_short>(3);
  BVar8 = min<4ul,4ul,unsigned_short,unsigned_short>(BVar8,BVar9);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_short>>(BVar6,BVar8);
  BVar1 = (anonymous_namespace)::boundedValue<5u,unsigned_char>('\x04');
  bounded<4u>();
  BVar2 = (anonymous_namespace)::boundedValue<5u,unsigned_char>('\x02');
  BVar2 = max<5UL,_4U,_unsigned_char>(BVar2.value);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<5ul,unsigned_char>>(BVar1,BVar2);
  BVar1 = (anonymous_namespace)::boundedValue<5u,unsigned_char>('\x04');
  BVar2 = (anonymous_namespace)::boundedValue<5u,unsigned_char>('\x02');
  bounded<4u>();
  BVar2 = max<5UL,_4U,_unsigned_char>(BVar2.value);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<5ul,unsigned_char>>(BVar1,BVar2);
  BVar3 = (anonymous_namespace)::boundedValue<4u,unsigned_char>('\x02');
  bounded<4u>();
  BVar1 = (anonymous_namespace)::boundedValue<5u,unsigned_char>('\x02');
  BVar4 = min<5UL,_4U,_unsigned_char>(BVar1.value);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_char>>(BVar3,BVar4);
  BVar3 = (anonymous_namespace)::boundedValue<4u,unsigned_char>('\x02');
  BVar1 = (anonymous_namespace)::boundedValue<5u,unsigned_char>('\x02');
  bounded<4u>();
  BVar4 = min<5UL,_4U,_unsigned_char>(BVar1.value);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_char>>(BVar3,BVar4);
  BVar6 = (anonymous_namespace)::boundedValue<4u,unsigned_short>(3);
  BVar8 = (anonymous_namespace)::boundedValue<4u,unsigned_short>(3);
  bounded<5u>();
  BVar8 = min<4UL,_5U,_unsigned_short>(BVar8.value);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_short>>(BVar6,BVar8);
  BVar6 = (anonymous_namespace)::boundedValue<4u,unsigned_short>(3);
  bounded<5u>();
  BVar8 = (anonymous_namespace)::boundedValue<4u,unsigned_short>(3);
  BVar8 = min<4UL,_5U,_unsigned_short>(BVar8.value);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_short>>(BVar6,BVar8);
  return;
}

Assistant:

TEST(AsyncUnixTest, SignalsNoWait) {
  // Verify that UnixEventPort::poll() correctly receives pending signals.

  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  bool receivedSigurg = false;
  bool receivedSigio = false;
  port.onSignal(SIGURG).then([&](siginfo_t&& info) {
    receivedSigurg = true;
    EXPECT_EQ(SIGURG, info.si_signo);
    EXPECT_SI_CODE(SI_USER, info.si_code);
  }).detach([](Exception&& e) { KJ_FAIL_EXPECT(e); });
  port.onSignal(SIGIO).then([&](siginfo_t&& info) {
    receivedSigio = true;
    EXPECT_EQ(SIGIO, info.si_signo);
    EXPECT_SI_CODE(SI_USER, info.si_code);
  }).detach([](Exception&& e) { KJ_FAIL_EXPECT(e); });

  kill(getpid(), SIGURG);
  kill(getpid(), SIGIO);

  EXPECT_FALSE(receivedSigurg);
  EXPECT_FALSE(receivedSigio);

  loop.run();

  EXPECT_FALSE(receivedSigurg);
  EXPECT_FALSE(receivedSigio);

  port.poll();

  EXPECT_FALSE(receivedSigurg);
  EXPECT_FALSE(receivedSigio);

  loop.run();

  EXPECT_TRUE(receivedSigurg);
  EXPECT_TRUE(receivedSigio);
}